

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ppu_registers.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3b725a::RegisterUint8_clear_bit_Test::~RegisterUint8_clear_bit_Test
          (RegisterUint8_clear_bit_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(RegisterUint8, clear_bit) {
    Register<uint8_t> reg(0b1111'0000);
    reg.clear_bit(0);
    EXPECT_FALSE(reg.is_set(0));
    EXPECT_EQ(0b1111'0000, reg.value());

    reg.clear_bit(7);
    EXPECT_FALSE(reg.is_set(7));
    EXPECT_EQ(0b0111'0000, reg.value());
}